

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t * convert_run_to_efficient_container(run_container_t *c,uint8_t *typecode_after)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  int32_t iVar6;
  int32_t n_runs;
  array_container_t *paVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  uint8_t uVar18;
  uint uVar19;
  uint size;
  
  lVar13 = cpuid_Extended_Feature_Enumeration_info(7);
  size = c->n_runs;
  uVar8 = (ulong)size;
  iVar12 = size * 4;
  if ((*(uint *)(lVar13 + 4) & 0x20) == 0) {
    if (0 < (int)size) {
      uVar11 = 0;
      do {
        size = size + c->runs[uVar11].length;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
  }
  else {
    size = _avx2_run_container_cardinality(c);
  }
  iVar9 = 0x1ffe;
  if ((int)(size * 2) < 0x1ffe) {
    iVar9 = size * 2;
  }
  uVar18 = '\x03';
  paVar7 = (array_container_t *)c;
  if (iVar9 < iVar12) {
    if ((int)size < 0x1001) {
      paVar7 = array_container_create_given_capacity(size);
      paVar7->cardinality = 0;
      iVar12 = c->n_runs;
      uVar18 = '\x02';
      if (0 < (long)iVar12) {
        prVar4 = c->runs;
        puVar5 = paVar7->array;
        lVar13 = 0;
        iVar6 = paVar7->cardinality;
        do {
          iVar9 = iVar6;
          uVar1 = prVar4[lVar13].value;
          uVar2 = prVar4[lVar13].length;
          lVar15 = 0;
          do {
            puVar5[iVar9 + lVar15] = uVar1 + (short)lVar15;
            lVar15 = lVar15 + 1;
            iVar14 = (int)lVar15;
          } while (uVar2 + 1 != iVar14);
          lVar13 = lVar13 + 1;
          iVar6 = iVar9 + iVar14;
        } while (lVar13 != iVar12);
        paVar7->cardinality = iVar9 + iVar14;
      }
    }
    else {
      paVar7 = (array_container_t *)bitset_container_create();
      iVar12 = c->n_runs;
      if (0 < (long)iVar12) {
        prVar4 = c->runs;
        puVar5 = paVar7->array;
        lVar13 = 0;
        do {
          uVar2 = prVar4[lVar13].value;
          uVar3 = prVar4[lVar13].length;
          if ((uint)uVar3 + (uint)uVar2 + 1 != (uint)uVar2) {
            uVar17 = (uint)uVar3 + (uint)uVar2;
            uVar10 = (uint)(uVar2 >> 6);
            uVar8 = -1L << ((byte)uVar2 & 0x3f);
            uVar19 = uVar17 >> 6;
            bVar16 = (byte)uVar17;
            if (uVar19 - uVar10 == 0) {
              bVar16 = ~bVar16;
              uVar8 = (uVar8 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f);
              uVar19 = uVar10;
            }
            else {
              *(ulong *)(puVar5 + (ulong)uVar10 * 4) =
                   *(ulong *)(puVar5 + (ulong)uVar10 * 4) | uVar8;
              if (uVar10 + 1 < uVar19) {
                memset(puVar5 + (ulong)(uVar2 >> 6) * 4 + 4,0xff,
                       (ulong)((uVar19 - uVar10) - 2) * 8 + 8);
              }
              uVar8 = 0xffffffffffffffff >> (~bVar16 & 0x3f);
            }
            *(ulong *)(puVar5 + (ulong)uVar19 * 4) = *(ulong *)(puVar5 + (ulong)uVar19 * 4) | uVar8;
          }
          lVar13 = lVar13 + 1;
        } while (iVar12 != lVar13);
      }
      paVar7->cardinality = size;
      uVar18 = '\x01';
    }
  }
  *typecode_after = uVar18;
  return paVar7;
}

Assistant:

container_t *convert_run_to_efficient_container(
    run_container_t *c,
    uint8_t *typecode_after
){
    int32_t size_as_run_container =
        run_container_serialized_size_in_bytes(c->n_runs);

    int32_t size_as_bitset_container =
        bitset_container_serialized_size_in_bytes();
    int32_t card = run_container_cardinality(c);
    int32_t size_as_array_container =
        array_container_serialized_size_in_bytes(card);

    int32_t min_size_non_run =
        size_as_bitset_container < size_as_array_container
            ? size_as_bitset_container
            : size_as_array_container;
    if (size_as_run_container <= min_size_non_run) {  // no conversion
        *typecode_after = RUN_CONTAINER_TYPE;
        return c;
    }
    if (card <= DEFAULT_MAX_SIZE) {
        // to array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
            int run_start = c->runs[rlepos].value;
            int run_end = run_start + c->runs[rlepos].length;

            for (int run_value = run_start; run_value <= run_end; ++run_value) {
                answer->array[answer->cardinality++] = (uint16_t)run_value;
            }
        }
        *typecode_after = ARRAY_CONTAINER_TYPE;
        return answer;
    }

    // else to bitset
    bitset_container_t *answer = bitset_container_create();

    for (int rlepos = 0; rlepos < c->n_runs; ++rlepos) {
        int start = c->runs[rlepos].value;
        int end = start + c->runs[rlepos].length;
        bitset_set_range(answer->words, start, end + 1);
    }
    answer->cardinality = card;
    *typecode_after = BITSET_CONTAINER_TYPE;
    return answer;
}